

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_map.h
# Opt level: O3

void __thiscall
lemon::
ArrayMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc,_std::vector<double,_std::allocator<double>_>_>
::clear(ArrayMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc,_std::vector<double,_std::allocator<double>_>_>
        *this)

{
  Container *pCVar1;
  pointer pdVar2;
  int iVar3;
  int id;
  int iVar4;
  
  iVar3 = this->capacity;
  if (iVar3 != 0) {
    pCVar1 = ((this->super_ObserverBase)._notifier)->container;
    iVar4 = (int)((ulong)((long)(pCVar1->super_SmartDigraphBase)._arcs.
                                super__Vector_base<lemon::SmartDigraphBase::ArcT,_std::allocator<lemon::SmartDigraphBase::ArcT>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pCVar1->super_SmartDigraphBase)._arcs.
                               super__Vector_base<lemon::SmartDigraphBase::ArcT,_std::allocator<lemon::SmartDigraphBase::ArcT>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4);
    if (iVar4 != 0) {
      do {
        iVar4 = iVar4 + -1;
        pdVar2 = this->values[iVar4].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (pdVar2 != (pointer)0x0) {
          operator_delete(pdVar2,(long)this->values[iVar4].
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_end_of_storage - (long)pdVar2);
        }
      } while (iVar4 != 0);
      iVar3 = this->capacity;
    }
    operator_delete(this->values,(long)iVar3 * 0x18);
    this->capacity = 0;
  }
  return;
}

Assistant:

virtual void clear() {
    Notifier* nf = Parent::notifier();
    if (capacity != 0) {
      Item it;
      for (nf->first(it); it != INVALID; nf->next(it)) {
        int id = nf->id(it);
        AllocatorTraits::destroy(allocator, &(values[id]));
      }
      allocator.deallocate(values, capacity);
      capacity = 0;
    }
  }